

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PolyConnectivity.cc
# Opt level: O3

HalfedgeHandle __thiscall
OpenMesh::PolyConnectivity::find_halfedge
          (PolyConnectivity *this,VertexHandle _start_vh,VertexHandle _end_vh)

{
  Vertex *pVVar1;
  Halfedge *pHVar2;
  undefined1 local_38 [8];
  ConstVertexOHalfedgeIter voh_it;
  
  if ((_start_vh.super_BaseHandle.idx_ == -1) || (_end_vh.super_BaseHandle.idx_ == -1)) {
    __assert_fail("_start_vh.is_valid() && _end_vh.is_valid()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/OpenMesh/Core/Mesh/PolyConnectivity.cc"
                  ,0x3a,
                  "PolyConnectivity::HalfedgeHandle OpenMesh::PolyConnectivity::find_halfedge(VertexHandle, VertexHandle) const"
                 );
  }
  pVVar1 = ArrayKernel::vertex(&this->super_ArrayKernel,_start_vh);
  voh_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_._0_4_ =
       (pVVar1->halfedge_handle_).super_BaseHandle.idx_;
  voh_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.start_.super_BaseHandle.idx_ =
       (BaseHandle)0x0;
  voh_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.heh_.super_BaseHandle.idx_ =
       (BaseHandle)0xffffffff;
  if (voh_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_._0_4_ != -1) {
    local_38 = (undefined1  [8])this;
    voh_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_._4_4_ =
         voh_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_._0_4_;
    do {
      if ((voh_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_._0_4_ ==
           voh_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_._4_4_) &&
         (voh_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.start_.super_BaseHandle.
          idx_ != 0)) {
        return (HalfedgeHandle)(BaseHandle)InvalidHalfedgeHandle.idx_;
      }
      pHVar2 = ArrayKernel::halfedge
                         (&this->super_ArrayKernel,
                          (HalfedgeHandle)
                          voh_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_.
                          _4_4_);
      if ((BaseHandle)(pHVar2->super_Halfedge_without_prev).vertex_handle_.super_BaseHandle.idx_ ==
          _end_vh.super_BaseHandle.idx_) {
        if (voh_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_._4_4_ != -1) {
          return (HalfedgeHandle)
                 (BaseHandle)
                 voh_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_._4_4_;
        }
        __assert_fail("this->heh_.is_valid()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/./OpenMesh/Core/Mesh/CirculatorsT.hh"
                      ,0x115,
                      "value_type OpenMesh::Iterators::GenericCirculatorT<OpenMesh::PolyConnectivity, OpenMesh::VertexHandle, OpenMesh::HalfedgeHandle, &OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toHalfedgeHandle>::operator*() const [Mesh = OpenMesh::PolyConnectivity, CenterEntityHandle = OpenMesh::VertexHandle, ValueHandle = OpenMesh::HalfedgeHandle, Handle2Value = &OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toHalfedgeHandle]"
                     );
      }
      Iterators::
      GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::HalfedgeHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toHalfedgeHandle>
      ::operator++((GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::HalfedgeHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toHalfedgeHandle>
                    *)local_38);
    } while (voh_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_._4_4_ != -1);
  }
  return (BaseHandle)(BaseHandle)InvalidHalfedgeHandle.idx_;
}

Assistant:

PolyConnectivity::HalfedgeHandle
PolyConnectivity::find_halfedge(VertexHandle _start_vh, VertexHandle _end_vh ) const
{
  assert(_start_vh.is_valid() && _end_vh.is_valid());

  for (ConstVertexOHalfedgeIter voh_it = cvoh_iter(_start_vh); voh_it.is_valid(); ++voh_it)
    if (to_vertex_handle(*voh_it) == _end_vh)
      return *voh_it;

  return InvalidHalfedgeHandle;
}